

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_attributes(CPState *cp,CPDecl *decl)

{
  CPDecl *decl_local;
  CPState *cp_local;
  
LAB_0019cb90:
  switch(cp->tok) {
  case 0x118:
    decl->attr = decl->attr | 0x2000000;
    break;
  case 0x119:
    decl->attr = decl->attr | 0x1000000;
    break;
  case 0x11a:
    break;
  default:
    return;
  case 0x121:
    break;
  case 0x122:
    cp_decl_asm(cp,decl);
    goto LAB_0019cb90;
  case 0x123:
    cp_decl_gccattribute(cp,decl);
    goto LAB_0019cb90;
  case 0x124:
    goto switchD_0019cbbd_caseD_124;
  case 0x125:
    break;
  case 0x126:
    decl->attr = decl->attr & 0xffff00ff | (cp->ct->size & 0xff) << 8;
  }
  cp_next(cp);
  goto LAB_0019cb90;
switchD_0019cbbd_caseD_124:
  cp_decl_msvcattribute(cp,decl);
  goto LAB_0019cb90;
}

Assistant:

static void cp_decl_attributes(CPState *cp, CPDecl *decl)
{
  for (;;) {
    switch (cp->tok) {
    case CTOK_CONST: decl->attr |= CTF_CONST; break;
    case CTOK_VOLATILE: decl->attr |= CTF_VOLATILE; break;
    case CTOK_RESTRICT: break;  /* Ignore. */
    case CTOK_EXTENSION: break;  /* Ignore. */
    case CTOK_ATTRIBUTE: cp_decl_gccattribute(cp, decl); continue;
    case CTOK_ASM: cp_decl_asm(cp, decl); continue;
    case CTOK_DECLSPEC: cp_decl_msvcattribute(cp, decl); continue;
    case CTOK_CCDECL:
#if LJ_TARGET_X86
      CTF_INSERT(decl->fattr, CCONV, cp->ct->size);
      decl->fattr |= CTFP_CCONV;
#endif
      break;
    case CTOK_PTRSZ:
#if LJ_64
      CTF_INSERT(decl->attr, MSIZEP, cp->ct->size);
#endif
      break;
    default: return;
    }
    cp_next(cp);
  }
}